

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vint4_sse2.h
# Opt level: O3

void embree::sse2::
     BVHNIntersectorKHybrid<4,_4,_1,_false,_embree::sse2::ArrayIntersectorK_1<4,_embree::sse2::ObjectIntersectorK<4,_false>_>,_false>
     ::intersectCoherent(vint<4> *valid_i,Intersectors *This,RayHitK<4> *ray,
                        RayQueryContext *context)

{
  float *pfVar1;
  float fVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  StackItemT<embree::NodeRefPtr<4>_> SVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  AccelData *pAVar8;
  long lVar9;
  long lVar10;
  undefined1 auVar11 [12];
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  undefined4 in_EAX;
  uint uVar19;
  undefined4 uVar20;
  int iVar21;
  StackItemT<embree::NodeRefPtr<4>_> *pSVar22;
  Geometry *pGVar23;
  ulong uVar24;
  _func_int **pp_Var25;
  StackItemT<embree::NodeRefPtr<4>_> *pSVar26;
  ulong uVar27;
  Geometry *pGVar28;
  ulong uVar29;
  ulong uVar30;
  StackItemT<embree::NodeRefPtr<4>_> *pSVar31;
  StackItemT<embree::NodeRefPtr<4>_> *pSVar32;
  ulong uVar33;
  uint uVar34;
  uint uVar35;
  undefined1 auVar36 [12];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  float fVar45;
  undefined1 auVar47 [12];
  undefined4 uVar46;
  float fVar60;
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar62 [12];
  float fVar61;
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  float fVar73;
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  uint uVar83;
  undefined1 auVar82 [16];
  undefined1 auVar84 [12];
  undefined1 auVar85 [12];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [12];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  float fVar118;
  float fVar119;
  undefined1 auVar120 [12];
  float fVar125;
  float fVar127;
  float fVar129;
  undefined1 auVar121 [16];
  float fVar126;
  float fVar128;
  float fVar130;
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar131 [12];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  float fVar140;
  float fVar141;
  float fVar142;
  float fVar143;
  vint<4> octant;
  undefined1 local_11c8 [8];
  float fStack_11c0;
  float fStack_11bc;
  undefined1 local_11b8 [16];
  RTCIntersectFunctionNArguments local_11a8;
  Geometry *local_1178;
  undefined8 local_1170;
  RTCIntersectArguments *local_1168;
  vfloat<4> fmin;
  undefined1 local_10e8 [16];
  undefined1 local_10d8 [16];
  undefined1 local_10c8 [16];
  float local_10b8;
  float fStack_10b4;
  float fStack_10b0;
  float fStack_10ac;
  float local_10a8;
  float fStack_10a4;
  float fStack_10a0;
  float fStack_109c;
  float local_1098;
  float fStack_1094;
  float fStack_1090;
  float fStack_108c;
  undefined1 local_1088 [16];
  undefined1 local_1078 [16];
  undefined1 local_1068 [16];
  undefined1 local_1058 [16];
  float local_1048;
  float fStack_1044;
  float fStack_1040;
  float fStack_103c;
  float local_1038;
  float fStack_1034;
  float fStack_1030;
  float fStack_102c;
  float local_1028;
  float fStack_1024;
  float fStack_1020;
  float fStack_101c;
  float local_1018;
  float fStack_1014;
  float fStack_1010;
  float fStack_100c;
  float local_1008;
  float fStack_1004;
  float fStack_1000;
  float fStack_ffc;
  float local_ff8;
  float fStack_ff4;
  float fStack_ff0;
  float fStack_fec;
  float local_fe8;
  float fStack_fe4;
  float fStack_fe0;
  float fStack_fdc;
  float local_fd8;
  float fStack_fd4;
  float fStack_fd0;
  float fStack_fcc;
  float local_fc8;
  float fStack_fc4;
  float fStack_fc0;
  float fStack_fbc;
  float local_fb8;
  float fStack_fb4;
  float fStack_fb0;
  float fStack_fac;
  undefined1 local_fa8 [16];
  undefined1 local_f98 [8];
  float fStack_f90;
  float fStack_f8c;
  undefined1 local_f88 [8];
  float fStack_f80;
  float fStack_f7c;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  undefined1 auVar66 [16];
  undefined1 auVar108 [16];
  
  auVar63._8_4_ = 0xffffffff;
  auVar63._0_8_ = 0xffffffffffffffff;
  auVar63._12_4_ = 0xffffffff;
  auVar86._0_4_ = -(uint)((valid_i->field_0).i[0] == -1);
  auVar86._4_4_ = -(uint)((valid_i->field_0).i[1] == -1);
  auVar86._8_4_ = -(uint)((valid_i->field_0).i[2] == -1);
  auVar86._12_4_ = -(uint)((valid_i->field_0).i[3] == -1);
  uVar19 = movmskps(in_EAX,auVar86);
  if (uVar19 != 0) {
    pAVar8 = This->ptr;
    uVar24 = (ulong)(uVar19 & 0xff);
    auVar137 = *(undefined1 (*) [16])ray;
    auVar138 = *(undefined1 (*) [16])(ray + 0x10);
    auVar139 = *(undefined1 (*) [16])(ray + 0x20);
    fVar45 = *(float *)(ray + 0x40);
    fVar60 = *(float *)(ray + 0x44);
    fVar61 = *(float *)(ray + 0x48);
    fVar73 = *(float *)(ray + 0x4c);
    fVar118 = (float)DAT_01f80d30;
    fVar125 = DAT_01f80d30._4_4_;
    fVar127 = DAT_01f80d30._8_4_;
    fVar129 = DAT_01f80d30._12_4_;
    auVar49._0_4_ = (uint)fVar45 & -(uint)(fVar118 <= ABS(fVar45));
    auVar49._4_4_ = (uint)fVar60 & -(uint)(fVar125 <= ABS(fVar60));
    auVar49._8_4_ = (uint)fVar61 & -(uint)(fVar127 <= ABS(fVar61));
    auVar49._12_4_ = (uint)fVar73 & -(uint)(fVar129 <= ABS(fVar73));
    auVar99._0_4_ = ~-(uint)(fVar118 <= ABS(fVar45)) & (uint)fVar118;
    auVar99._4_4_ = ~-(uint)(fVar125 <= ABS(fVar60)) & (uint)fVar125;
    auVar99._8_4_ = ~-(uint)(fVar127 <= ABS(fVar61)) & (uint)fVar127;
    auVar99._12_4_ = ~-(uint)(fVar129 <= ABS(fVar73)) & (uint)fVar129;
    auVar99 = auVar99 | auVar49;
    fVar2 = *(float *)(ray + 0x50);
    fVar12 = *(float *)(ray + 0x54);
    fVar13 = *(float *)(ray + 0x58);
    fVar14 = *(float *)(ray + 0x5c);
    auVar88._0_4_ = (uint)fVar2 & -(uint)(fVar118 <= ABS(fVar2));
    auVar88._4_4_ = (uint)fVar12 & -(uint)(fVar125 <= ABS(fVar12));
    auVar88._8_4_ = (uint)fVar13 & -(uint)(fVar127 <= ABS(fVar13));
    auVar88._12_4_ = (uint)fVar14 & -(uint)(fVar129 <= ABS(fVar14));
    auVar110._0_4_ = ~-(uint)(fVar118 <= ABS(fVar2)) & (uint)fVar118;
    auVar110._4_4_ = ~-(uint)(fVar125 <= ABS(fVar12)) & (uint)fVar125;
    auVar110._8_4_ = ~-(uint)(fVar127 <= ABS(fVar13)) & (uint)fVar127;
    auVar110._12_4_ = ~-(uint)(fVar129 <= ABS(fVar14)) & (uint)fVar129;
    auVar110 = auVar110 | auVar88;
    fVar15 = *(float *)(ray + 0x60);
    fVar16 = *(float *)(ray + 100);
    fVar17 = *(float *)(ray + 0x68);
    fVar18 = *(float *)(ray + 0x6c);
    auVar132._0_4_ = (uint)fVar15 & -(uint)(fVar118 <= ABS(fVar15));
    auVar132._4_4_ = (uint)fVar16 & -(uint)(fVar125 <= ABS(fVar16));
    auVar132._8_4_ = (uint)fVar17 & -(uint)(fVar127 <= ABS(fVar17));
    auVar132._12_4_ = (uint)fVar18 & -(uint)(fVar129 <= ABS(fVar18));
    auVar94._0_4_ = ~-(uint)(fVar118 <= ABS(fVar15)) & (uint)fVar118;
    auVar94._4_4_ = ~-(uint)(fVar125 <= ABS(fVar16)) & (uint)fVar125;
    auVar94._8_4_ = ~-(uint)(fVar127 <= ABS(fVar17)) & (uint)fVar127;
    auVar94._12_4_ = ~-(uint)(fVar129 <= ABS(fVar18)) & (uint)fVar129;
    auVar94 = auVar94 | auVar132;
    auVar121 = rcpps(_DAT_01f80d30,auVar99);
    fVar140 = auVar121._0_4_;
    auVar134._0_4_ = auVar99._0_4_ * fVar140;
    fVar141 = auVar121._4_4_;
    auVar134._4_4_ = auVar99._4_4_ * fVar141;
    fVar142 = auVar121._8_4_;
    auVar134._8_4_ = auVar99._8_4_ * fVar142;
    fVar143 = auVar121._12_4_;
    auVar134._12_4_ = auVar99._12_4_ * fVar143;
    fVar140 = (1.0 - auVar134._0_4_) * fVar140 + fVar140;
    fVar141 = (1.0 - auVar134._4_4_) * fVar141 + fVar141;
    fVar142 = (1.0 - auVar134._8_4_) * fVar142 + fVar142;
    fVar143 = (1.0 - auVar134._12_4_) * fVar143 + fVar143;
    auVar121 = rcpps(auVar134,auVar110);
    fVar119 = auVar121._0_4_;
    fVar126 = auVar121._4_4_;
    fVar128 = auVar121._8_4_;
    fVar130 = auVar121._12_4_;
    fVar119 = (1.0 - auVar110._0_4_ * fVar119) * fVar119 + fVar119;
    fVar126 = (1.0 - auVar110._4_4_ * fVar126) * fVar126 + fVar126;
    fVar128 = (1.0 - auVar110._8_4_ * fVar128) * fVar128 + fVar128;
    fVar130 = (1.0 - auVar110._12_4_ * fVar130) * fVar130 + fVar130;
    auVar121 = rcpps(auVar121,auVar94);
    fVar118 = auVar121._0_4_;
    fVar125 = auVar121._4_4_;
    fVar127 = auVar121._8_4_;
    fVar129 = auVar121._12_4_;
    fVar118 = (1.0 - auVar94._0_4_ * fVar118) * fVar118 + fVar118;
    fVar125 = (1.0 - auVar94._4_4_ * fVar125) * fVar125 + fVar125;
    fVar127 = (1.0 - auVar94._8_4_ * fVar127) * fVar127 + fVar127;
    fVar129 = (1.0 - auVar94._12_4_ * fVar129) * fVar129 + fVar129;
    auVar102._0_12_ = ZEXT812(0);
    auVar102._12_4_ = 0;
    local_10c8 = maxps(*(undefined1 (*) [16])(ray + 0x30),auVar102);
    auVar121._0_8_ = CONCAT44(-(uint)(fVar60 < 0.0),-(uint)(fVar45 < 0.0)) & 0x100000001;
    auVar121._8_4_ = -(uint)(fVar61 < 0.0) & 1;
    auVar121._12_4_ = -(uint)(fVar73 < 0.0) & 1;
    local_10d8 = maxps(*(undefined1 (*) [16])(ray + 0x80),auVar102);
    auVar74._0_8_ = CONCAT44(-(uint)(fVar12 < 0.0),-(uint)(fVar2 < 0.0)) & 0x200000002;
    auVar74._8_4_ = -(uint)(fVar13 < 0.0) & 2;
    auVar74._12_4_ = -(uint)(fVar14 < 0.0) & 2;
    auVar114._0_8_ = CONCAT44(-(uint)(fVar16 < 0.0),-(uint)(fVar15 < 0.0)) & 0x400000004;
    auVar114._8_4_ = -(uint)(fVar17 < 0.0) & 4;
    auVar114._12_4_ = -(uint)(fVar18 < 0.0) & 4;
    local_10e8 = auVar86 ^ auVar63 | auVar121 | auVar114 | auVar74;
    local_1068 = auVar137;
    local_1078 = auVar138;
    local_1088 = auVar139;
    local_1098 = fVar118;
    fStack_1094 = fVar125;
    fStack_1090 = fVar127;
    fStack_108c = fVar129;
    local_10a8 = fVar140;
    fStack_10a4 = fVar141;
    fStack_10a0 = fVar142;
    fStack_109c = fVar143;
    local_10b8 = fVar119;
    fStack_10b4 = fVar126;
    fStack_10b0 = fVar128;
    fStack_10ac = fVar130;
    local_11a8.context = (RTCRayQueryContext *)pAVar8;
    do {
      lVar9 = 0;
      if (uVar24 != 0) {
        for (; (uVar24 >> lVar9 & 1) == 0; lVar9 = lVar9 + 1) {
        }
      }
      iVar21 = *(int *)(local_10e8 + lVar9 * 4);
      auVar37._0_4_ = -(uint)(iVar21 == local_10e8._0_4_);
      auVar37._4_4_ = -(uint)(iVar21 == local_10e8._4_4_);
      auVar37._8_4_ = -(uint)(iVar21 == local_10e8._8_4_);
      auVar37._12_4_ = -(uint)(iVar21 == local_10e8._12_4_);
      uVar20 = movmskps((int)lVar9,auVar37);
      auVar74 = ~auVar37 & _DAT_01f7a9f0;
      auVar121 = local_10c8 & auVar37 | auVar74;
      auVar63 = ~auVar37 & _DAT_01f7aa00;
      _local_11c8 = local_10d8 & auVar37 | auVar63;
      auVar86 = auVar137 & auVar37 | auVar74;
      auVar95._4_4_ = auVar86._0_4_;
      auVar95._0_4_ = auVar86._4_4_;
      auVar95._8_4_ = auVar86._12_4_;
      auVar95._12_4_ = auVar86._8_4_;
      auVar86 = minps(auVar95,auVar86);
      auVar100._0_8_ = auVar86._8_8_;
      auVar100._8_4_ = auVar86._0_4_;
      auVar100._12_4_ = auVar86._4_4_;
      auVar94 = minps(auVar100,auVar86);
      auVar86 = auVar138 & auVar37 | auVar74;
      auVar111._4_4_ = auVar86._0_4_;
      auVar111._0_4_ = auVar86._4_4_;
      auVar111._8_4_ = auVar86._12_4_;
      auVar111._12_4_ = auVar86._8_4_;
      auVar86 = minps(auVar111,auVar86);
      auVar133._0_8_ = auVar86._8_8_;
      auVar133._8_4_ = auVar86._0_4_;
      auVar133._12_4_ = auVar86._4_4_;
      auVar134 = minps(auVar133,auVar86);
      auVar86 = auVar139 & auVar37 | auVar74;
      auVar112._4_4_ = auVar86._0_4_;
      auVar112._0_4_ = auVar86._4_4_;
      auVar112._8_4_ = auVar86._12_4_;
      auVar112._12_4_ = auVar86._8_4_;
      auVar86 = minps(auVar112,auVar86);
      auVar101._0_8_ = auVar86._8_8_;
      auVar101._8_4_ = auVar86._0_4_;
      auVar101._12_4_ = auVar86._4_4_;
      auVar102 = minps(auVar101,auVar86);
      auVar86 = auVar137 & auVar37 | auVar63;
      auVar103._4_4_ = auVar86._0_4_;
      auVar103._0_4_ = auVar86._4_4_;
      auVar103._8_4_ = auVar86._12_4_;
      auVar103._12_4_ = auVar86._8_4_;
      auVar86 = maxps(auVar103,auVar86);
      auVar48._0_8_ = auVar86._8_8_;
      auVar48._8_4_ = auVar86._0_4_;
      auVar48._12_4_ = auVar86._4_4_;
      auVar49 = maxps(auVar48,auVar86);
      auVar86 = auVar138 & auVar37 | auVar63;
      auVar104._4_4_ = auVar86._0_4_;
      auVar104._0_4_ = auVar86._4_4_;
      auVar104._8_4_ = auVar86._12_4_;
      auVar104._12_4_ = auVar86._8_4_;
      auVar86 = maxps(auVar104,auVar86);
      auVar122._0_8_ = auVar86._8_8_;
      auVar122._8_4_ = auVar86._0_4_;
      auVar122._12_4_ = auVar86._4_4_;
      auVar99 = maxps(auVar122,auVar86);
      auVar86 = auVar139 & auVar37 | auVar63;
      auVar50._4_4_ = auVar86._0_4_;
      auVar50._0_4_ = auVar86._4_4_;
      auVar50._8_4_ = auVar86._12_4_;
      auVar50._12_4_ = auVar86._8_4_;
      auVar86 = maxps(auVar50,auVar86);
      auVar87._0_8_ = auVar86._8_8_;
      auVar87._8_4_ = auVar86._0_4_;
      auVar87._12_4_ = auVar86._4_4_;
      auVar88 = maxps(auVar87,auVar86);
      auVar89._0_8_ = CONCAT44((uint)fVar141 & auVar37._4_4_,(uint)fVar140 & auVar37._0_4_);
      auVar89._8_4_ = (uint)fVar142 & auVar37._8_4_;
      auVar89._12_4_ = (uint)fVar143 & auVar37._12_4_;
      auVar96._8_4_ = auVar89._8_4_;
      auVar96._0_8_ = auVar89._0_8_;
      auVar96._12_4_ = auVar89._12_4_;
      auVar96 = auVar96 | auVar74;
      auVar51._4_4_ = auVar96._0_4_;
      auVar51._0_4_ = auVar96._4_4_;
      auVar51._8_4_ = auVar96._12_4_;
      auVar51._12_4_ = auVar96._8_4_;
      auVar86 = minps(auVar51,auVar96);
      auVar97._0_8_ = CONCAT44((uint)fVar126 & auVar37._4_4_,(uint)fVar119 & auVar37._0_4_);
      auVar97._8_4_ = (uint)fVar128 & auVar37._8_4_;
      auVar97._12_4_ = (uint)fVar130 & auVar37._12_4_;
      auVar105._8_4_ = auVar97._8_4_;
      auVar105._0_8_ = auVar97._0_8_;
      auVar105._12_4_ = auVar97._12_4_;
      auVar105 = auVar105 | auVar74;
      auVar113._4_4_ = auVar105._0_4_;
      auVar113._0_4_ = auVar105._4_4_;
      auVar113._8_4_ = auVar105._12_4_;
      auVar113._12_4_ = auVar105._8_4_;
      auVar114 = minps(auVar113,auVar105);
      auVar38._0_4_ = auVar37._0_4_ & (uint)fVar118;
      auVar38._4_4_ = auVar37._4_4_ & (uint)fVar125;
      auVar38._8_4_ = auVar37._8_4_ & (uint)fVar127;
      auVar38._12_4_ = auVar37._12_4_ & (uint)fVar129;
      auVar74 = auVar74 | auVar38;
      auVar106._4_4_ = auVar74._0_4_;
      auVar106._0_4_ = auVar74._4_4_;
      auVar106._8_4_ = auVar74._12_4_;
      auVar106._12_4_ = auVar74._8_4_;
      auVar74 = minps(auVar106,auVar74);
      auVar75._0_8_ = auVar74._8_8_;
      auVar75._8_4_ = auVar74._0_4_;
      auVar75._12_4_ = auVar74._4_4_;
      auVar74 = minps(auVar75,auVar74);
      auVar108._0_8_ = auVar86._0_8_;
      auVar108._8_4_ = auVar86._4_4_;
      auVar108._12_4_ = auVar114._4_4_;
      auVar107._8_8_ = auVar108._8_8_;
      auVar107._0_4_ = auVar86._0_4_;
      auVar107._4_4_ = auVar114._0_4_;
      auVar52._4_4_ = auVar114._8_4_;
      auVar52._0_4_ = auVar86._8_4_;
      auVar52._8_4_ = auVar86._12_4_;
      auVar52._12_4_ = auVar114._12_4_;
      auVar86 = minps(auVar52,auVar107);
      fVar73 = auVar74._0_4_;
      fVar45 = auVar86._0_4_;
      fVar60 = auVar86._4_4_;
      auVar89 = auVar89 | auVar63;
      auVar76._4_4_ = auVar89._0_4_;
      auVar76._0_4_ = auVar89._4_4_;
      auVar76._8_4_ = auVar89._12_4_;
      auVar76._12_4_ = auVar89._8_4_;
      auVar74 = maxps(auVar76,auVar89);
      auVar97 = auVar97 | auVar63;
      auVar90._4_4_ = auVar97._0_4_;
      auVar90._0_4_ = auVar97._4_4_;
      auVar90._8_4_ = auVar97._12_4_;
      auVar90._12_4_ = auVar97._8_4_;
      auVar114 = maxps(auVar90,auVar97);
      auVar38 = auVar38 | auVar63;
      auVar64._4_4_ = auVar38._0_4_;
      auVar64._0_4_ = auVar38._4_4_;
      auVar64._8_4_ = auVar38._12_4_;
      auVar64._12_4_ = auVar38._8_4_;
      auVar86 = maxps(auVar64,auVar38);
      auVar39._0_8_ = auVar86._8_8_;
      auVar39._8_4_ = auVar86._0_4_;
      auVar39._12_4_ = auVar86._4_4_;
      auVar86 = maxps(auVar39,auVar86);
      auVar66._0_8_ = auVar74._0_8_;
      auVar66._8_4_ = auVar74._4_4_;
      auVar66._12_4_ = auVar114._4_4_;
      auVar65._8_8_ = auVar66._8_8_;
      auVar65._0_4_ = auVar74._0_4_;
      auVar65._4_4_ = auVar114._0_4_;
      auVar77._4_4_ = auVar114._8_4_;
      auVar77._0_4_ = auVar74._8_4_;
      auVar77._8_4_ = auVar74._12_4_;
      auVar77._12_4_ = auVar114._12_4_;
      auVar74 = maxps(auVar77,auVar65);
      auVar115._4_4_ = auVar121._0_4_;
      auVar115._0_4_ = auVar121._4_4_;
      auVar115._8_4_ = auVar121._12_4_;
      auVar115._12_4_ = auVar121._8_4_;
      auVar114 = minps(auVar115,auVar121);
      auVar40._4_4_ = local_11c8._0_4_;
      auVar40._0_4_ = local_11c8._4_4_;
      auVar40._8_4_ = local_11c8._12_4_;
      auVar40._12_4_ = local_11c8._8_4_;
      auVar63 = maxps(auVar40,_local_11c8);
      auVar67._0_8_ = auVar63._8_8_;
      auVar67._8_4_ = auVar63._0_4_;
      auVar67._12_4_ = auVar63._4_4_;
      local_11b8 = maxps(auVar67,auVar63);
      uVar19 = -(uint)(fVar45 < 0.0);
      uVar34 = -(uint)(fVar60 < 0.0);
      uVar35 = -(uint)(fVar73 < 0.0);
      auVar84._0_4_ = ~uVar19 & (uint)fVar45;
      auVar84._4_4_ = ~uVar34 & (uint)fVar60;
      auVar84._8_4_ = ~uVar35 & (uint)fVar73;
      auVar62._0_4_ = auVar74._0_4_ & uVar19;
      auVar62._4_4_ = auVar74._4_4_ & uVar34;
      auVar62._8_4_ = auVar86._0_4_ & uVar35;
      auVar62 = auVar62 | auVar84;
      auVar85._0_4_ = ~uVar19 & auVar49._0_4_;
      auVar85._4_4_ = ~uVar34 & auVar99._0_4_;
      auVar85._8_4_ = ~uVar35 & auVar88._0_4_;
      auVar93._0_4_ = ~uVar19 & auVar94._0_4_;
      auVar93._4_4_ = ~uVar34 & auVar134._0_4_;
      auVar93._8_4_ = ~uVar35 & auVar102._0_4_;
      auVar131._0_4_ = auVar94._0_4_ & uVar19;
      auVar131._4_4_ = auVar134._0_4_ & uVar34;
      auVar131._8_4_ = auVar102._0_4_ & uVar35;
      auVar131 = auVar131 | auVar85;
      auVar120._0_4_ = auVar49._0_4_ & uVar19;
      auVar120._4_4_ = auVar99._0_4_ & uVar34;
      auVar120._8_4_ = auVar88._0_4_ & uVar35;
      fVar61 = auVar62._0_4_;
      local_fb8 = auVar62._4_4_;
      local_ff8 = auVar62._8_4_;
      fStack_fb4 = local_fb8;
      fStack_fb0 = local_fb8;
      fStack_fac = local_fb8;
      uVar30 = (ulong)(local_fb8 < 0.0) << 4 | 0x20;
      auVar120 = auVar120 | auVar93;
      uVar33 = (ulong)(local_ff8 < 0.0) << 4 | 0x40;
      auVar47._0_4_ = (uint)fVar45 & uVar19;
      auVar47._4_4_ = (uint)fVar60 & uVar34;
      auVar47._8_4_ = (uint)fVar73 & uVar35;
      auVar36._0_4_ = ~uVar19 & auVar74._0_4_;
      auVar36._4_4_ = ~uVar34 & auVar74._4_4_;
      auVar36._8_4_ = ~uVar35 & auVar86._0_4_;
      auVar36 = auVar36 | auVar47;
      local_fd8 = auVar131._0_4_ * fVar61;
      local_fe8 = auVar131._4_4_ * local_fb8;
      fStack_f80 = auVar131._8_4_ * local_ff8;
      local_1008 = auVar36._0_4_;
      local_1018 = auVar120._0_4_ * local_1008;
      local_1028 = auVar36._4_4_;
      local_1038 = auVar120._4_4_ * local_1028;
      local_1048 = auVar36._8_4_;
      fStack_f90 = auVar120._8_4_ * local_1048;
      pSVar22 = *(StackItemT<embree::NodeRefPtr<4>_> **)&pAVar8[1].bounds.bounds0.lower.field_0;
      stack[0].ptr.ptr = (size_t)pSVar22;
      stack[0].dist = 0;
      local_fc8 = fVar61;
      fStack_fc4 = fVar61;
      fStack_fc0 = fVar61;
      fStack_fbc = fVar61;
      fStack_fd4 = local_fd8;
      fStack_fd0 = local_fd8;
      fStack_fcc = local_fd8;
      fStack_fe4 = local_fe8;
      fStack_fe0 = local_fe8;
      fStack_fdc = local_fe8;
      fStack_ff4 = local_ff8;
      fStack_ff0 = local_ff8;
      fStack_fec = local_ff8;
      local_f88._4_4_ = fStack_f80;
      local_f88._0_4_ = fStack_f80;
      fStack_f7c = fStack_f80;
      fStack_1004 = local_1008;
      fStack_1000 = local_1008;
      fStack_ffc = local_1008;
      fStack_1014 = local_1018;
      fStack_1010 = local_1018;
      fStack_100c = local_1018;
      fStack_1024 = local_1028;
      fStack_1020 = local_1028;
      fStack_101c = local_1028;
      uVar46 = auVar114._0_4_;
      auVar116._8_4_ = auVar114._8_4_;
      auVar53._4_4_ = uVar46;
      auVar53._0_4_ = uVar46;
      auVar53._8_4_ = uVar46;
      auVar53._12_4_ = uVar46;
      auVar116._4_4_ = auVar116._8_4_;
      auVar116._0_4_ = auVar116._8_4_;
      auVar116._12_4_ = auVar116._8_4_;
      local_fa8 = minps(auVar116,auVar53);
      fStack_1034 = local_1038;
      fStack_1030 = local_1038;
      fStack_102c = local_1038;
      fStack_1044 = local_1048;
      fStack_1040 = local_1048;
      fStack_103c = local_1048;
      local_f98._4_4_ = fStack_f90;
      local_f98._0_4_ = fStack_f90;
      fStack_f8c = fStack_f90;
      auVar41._4_4_ = local_11b8._0_4_;
      auVar41._0_4_ = local_11b8._0_4_;
      auVar41._8_4_ = local_11b8._0_4_;
      auVar41._12_4_ = local_11b8._0_4_;
      pSVar26 = stack + 1;
      do {
        fVar45 = (float)pSVar26[-1].dist;
        pSVar26 = pSVar26 + -1;
        auVar54._4_4_ = fVar45;
        auVar54._0_4_ = fVar45;
        auVar54._8_4_ = fVar45;
        auVar54._12_4_ = fVar45;
        auVar68._4_4_ = -(uint)(fVar45 < (float)local_11c8._4_4_);
        auVar68._0_4_ = -(uint)(fVar45 < (float)local_11c8._0_4_);
        auVar68._8_4_ = -(uint)(fVar45 < fStack_11c0);
        auVar68._12_4_ = -(uint)(fVar45 < fStack_11bc);
        uVar19 = movmskps((int)pSVar22,auVar68);
        if (uVar19 != 0) {
          pSVar22 = (StackItemT<embree::NodeRefPtr<4>_> *)(ulong)uVar19;
          pSVar31 = (StackItemT<embree::NodeRefPtr<4>_> *)(pSVar26->ptr).ptr;
          while (((ulong)pSVar31 & 8) == 0) {
            pSVar22 = pSVar31 + (ulong)(fVar61 < 0.0) + 2;
            auVar55._0_4_ = *(float *)&(pSVar22->ptr).ptr * local_fc8 - local_fd8;
            auVar55._4_4_ = *(float *)((long)&(pSVar22->ptr).ptr + 4) * fStack_fc4 - fStack_fd4;
            auVar55._8_4_ = (float)pSVar22->dist * fStack_fc0 - fStack_fd0;
            auVar55._12_4_ = *(float *)&pSVar22->field_0xc * fStack_fbc - fStack_fcc;
            pfVar1 = (float *)((long)&pSVar31[2].ptr.ptr + uVar30);
            auVar69._0_4_ = *pfVar1 * local_fb8 - local_fe8;
            auVar69._4_4_ = pfVar1[1] * fStack_fb4 - fStack_fe4;
            auVar69._8_4_ = pfVar1[2] * fStack_fb0 - fStack_fe0;
            auVar69._12_4_ = pfVar1[3] * fStack_fac - fStack_fdc;
            auVar86 = maxps(auVar55,auVar69);
            pfVar1 = (float *)((long)&pSVar31[2].ptr.ptr + uVar33);
            auVar70._0_4_ = *pfVar1 * local_ff8 - (float)local_f88._0_4_;
            auVar70._4_4_ = pfVar1[1] * fStack_ff4 - (float)local_f88._4_4_;
            auVar70._8_4_ = pfVar1[2] * fStack_ff0 - fStack_f80;
            auVar70._12_4_ = pfVar1[3] * fStack_fec - fStack_f7c;
            auVar63 = maxps(auVar70,local_fa8);
            fmin.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)maxps(auVar86,auVar63);
            pfVar1 = (float *)((long)&pSVar31[2].ptr.ptr + ((ulong)(fVar61 < 0.0) * 0x10 ^ 0x10));
            auVar71._0_4_ = *pfVar1 * local_1008 - local_1018;
            auVar71._4_4_ = pfVar1[1] * fStack_1004 - fStack_1014;
            auVar71._8_4_ = pfVar1[2] * fStack_1000 - fStack_1010;
            auVar71._12_4_ = pfVar1[3] * fStack_ffc - fStack_100c;
            pfVar1 = (float *)((long)&pSVar31[2].ptr.ptr + (uVar30 ^ 0x10));
            auVar78._0_4_ = *pfVar1 * local_1028 - local_1038;
            auVar78._4_4_ = pfVar1[1] * fStack_1024 - fStack_1034;
            auVar78._8_4_ = pfVar1[2] * fStack_1020 - fStack_1030;
            auVar78._12_4_ = pfVar1[3] * fStack_101c - fStack_102c;
            auVar86 = minps(auVar71,auVar78);
            pfVar1 = (float *)((long)&pSVar31[2].ptr.ptr + (uVar33 ^ 0x10));
            auVar79._0_4_ = *pfVar1 * local_1048 - (float)local_f98._0_4_;
            auVar79._4_4_ = pfVar1[1] * fStack_1044 - (float)local_f98._4_4_;
            auVar79._8_4_ = pfVar1[2] * fStack_1040 - fStack_f90;
            auVar79._12_4_ = pfVar1[3] * fStack_103c - fStack_f8c;
            auVar63 = minps(auVar79,auVar41);
            auVar86 = minps(auVar86,auVar63);
            auVar56._4_4_ = -(uint)(fmin.field_0._4_4_ <= auVar86._4_4_);
            auVar56._0_4_ = -(uint)(fmin.field_0._0_4_ <= auVar86._0_4_);
            auVar56._8_4_ = -(uint)(fmin.field_0._8_4_ <= auVar86._8_4_);
            auVar56._12_4_ = -(uint)(fmin.field_0._12_4_ <= auVar86._12_4_);
            uVar19 = movmskps((int)uVar30,auVar56);
            local_11a8.context = (RTCRayQueryContext *)(ulong)uVar19;
            if (uVar19 == 0) goto LAB_00206405;
            uVar29 = (ulong)(byte)uVar19;
            uVar27 = 0;
            pSVar22 = (StackItemT<embree::NodeRefPtr<4>_> *)0x8;
            auVar54 = _DAT_01f7a9f0;
            do {
              lVar10 = 0;
              if (uVar29 != 0) {
                for (; (uVar29 >> lVar10 & 1) == 0; lVar10 = lVar10 + 1) {
                }
              }
              fVar45 = *(float *)((long)&pSVar31[2].ptr.ptr + lVar10 * 4);
              fVar60 = *(float *)((long)&pSVar31[3].ptr.ptr + lVar10 * 4);
              fVar73 = *(float *)((long)&pSVar31[4].ptr.ptr + lVar10 * 4);
              fVar2 = *(float *)((long)&pSVar31[5].ptr.ptr + lVar10 * 4);
              auVar72._0_8_ =
                   CONCAT44((fVar45 - auVar137._4_4_) * fVar141,(fVar45 - auVar137._0_4_) * fVar140)
              ;
              auVar72._8_4_ = (fVar45 - auVar137._8_4_) * fVar142;
              auVar72._12_4_ = (fVar45 - auVar137._12_4_) * fVar143;
              auVar80._0_8_ =
                   CONCAT44((fVar73 - auVar138._4_4_) * fVar126,(fVar73 - auVar138._0_4_) * fVar119)
              ;
              auVar80._8_4_ = (fVar73 - auVar138._8_4_) * fVar128;
              auVar80._12_4_ = (fVar73 - auVar138._12_4_) * fVar130;
              fVar45 = *(float *)((long)&pSVar31[6].ptr.ptr + lVar10 * 4);
              auVar109._0_8_ =
                   CONCAT44((fVar45 - auVar139._4_4_) * fVar125,(fVar45 - auVar139._0_4_) * fVar118)
              ;
              auVar109._8_4_ = (fVar45 - auVar139._8_4_) * fVar127;
              auVar109._12_4_ = (fVar45 - auVar139._12_4_) * fVar129;
              auVar91._0_4_ = (fVar60 - auVar137._0_4_) * fVar140;
              auVar91._4_4_ = (fVar60 - auVar137._4_4_) * fVar141;
              auVar91._8_4_ = (fVar60 - auVar137._8_4_) * fVar142;
              auVar91._12_4_ = (fVar60 - auVar137._12_4_) * fVar143;
              auVar98._0_4_ = (fVar2 - auVar138._0_4_) * fVar119;
              auVar98._4_4_ = (fVar2 - auVar138._4_4_) * fVar126;
              auVar98._8_4_ = (fVar2 - auVar138._8_4_) * fVar128;
              auVar98._12_4_ = (fVar2 - auVar138._12_4_) * fVar130;
              fVar45 = *(float *)((long)&pSVar31[7].ptr.ptr + lVar10 * 4);
              auVar117._0_4_ = (fVar45 - auVar139._0_4_) * fVar118;
              auVar117._4_4_ = (fVar45 - auVar139._4_4_) * fVar125;
              auVar117._8_4_ = (fVar45 - auVar139._8_4_) * fVar127;
              auVar117._12_4_ = (fVar45 - auVar139._12_4_) * fVar129;
              auVar123._8_4_ = auVar72._8_4_;
              auVar123._0_8_ = auVar72._0_8_;
              auVar123._12_4_ = auVar72._12_4_;
              auVar86 = minps(auVar123,auVar91);
              auVar135._8_4_ = auVar80._8_4_;
              auVar135._0_8_ = auVar80._0_8_;
              auVar135._12_4_ = auVar80._12_4_;
              auVar63 = minps(auVar135,auVar98);
              auVar86 = maxps(auVar86,auVar63);
              auVar136._8_4_ = auVar109._8_4_;
              auVar136._0_8_ = auVar109._0_8_;
              auVar136._12_4_ = auVar109._12_4_;
              auVar63 = minps(auVar136,auVar117);
              auVar49 = maxps(auVar86,auVar63);
              auVar86 = maxps(auVar72,auVar91);
              auVar63 = maxps(auVar80,auVar98);
              auVar86 = minps(auVar86,auVar63);
              auVar63 = maxps(auVar109,auVar117);
              auVar86 = minps(auVar86,auVar63);
              auVar63 = maxps(auVar49,auVar121);
              auVar86 = minps(auVar86,_local_11c8);
              auVar124._4_4_ = -(uint)(auVar63._4_4_ <= auVar86._4_4_);
              auVar124._0_4_ = -(uint)(auVar63._0_4_ <= auVar86._0_4_);
              auVar124._8_4_ = -(uint)(auVar63._8_4_ <= auVar86._8_4_);
              auVar124._12_4_ = -(uint)(auVar63._12_4_ <= auVar86._12_4_);
              uVar19 = movmskps((int)valid_i,auVar124);
              valid_i = (vint<4> *)(ulong)uVar19;
              pSVar32 = pSVar22;
              if (uVar19 != 0) {
                fVar45 = fmin.field_0.v[lVar10];
                auVar86 = ZEXT416((uint)fVar45);
                pSVar32 = (StackItemT<embree::NodeRefPtr<4>_> *)(&pSVar31->ptr)[lVar10].ptr;
                auVar92._4_4_ = -(uint)(fVar45 < auVar54._4_4_);
                auVar92._0_4_ = -(uint)(fVar45 < auVar54._0_4_);
                auVar92._8_4_ = -(uint)(fVar45 < auVar54._8_4_);
                auVar92._12_4_ = -(uint)(fVar45 < auVar54._12_4_);
                uVar19 = movmskps(uVar19,auVar92);
                valid_i = (vint<4> *)(ulong)uVar19;
                if (uVar19 == 0) {
                  (pSVar26->ptr).ptr = (size_t)pSVar32;
                  pSVar32 = pSVar22;
                  auVar57 = auVar54;
                }
                else {
                  if (pSVar22 == (StackItemT<embree::NodeRefPtr<4>_> *)0x8) {
                    auVar54._8_4_ = fVar45;
                    auVar54._0_8_ = CONCAT44(fVar45,fVar45);
                    auVar54._12_4_ = fVar45;
                    goto LAB_00206197;
                  }
                  (pSVar26->ptr).ptr = (size_t)pSVar22;
                  auVar57._8_4_ = fVar45;
                  auVar57._0_8_ = CONCAT44(fVar45,fVar45);
                  auVar57._12_4_ = fVar45;
                  auVar86 = auVar54;
                }
                auVar54 = auVar57;
                uVar27 = uVar27 + 1;
                pSVar26->dist = auVar86._0_4_;
                pSVar26 = pSVar26 + 1;
              }
LAB_00206197:
              local_11a8.context = (RTCRayQueryContext *)(uVar29 - 1);
              uVar29 = uVar29 & (ulong)local_11a8.context;
              pSVar22 = pSVar32;
            } while (uVar29 != 0);
            if (pSVar32 == (StackItemT<embree::NodeRefPtr<4>_> *)0x8) goto LAB_00206405;
            pSVar22 = pSVar31;
            pSVar31 = pSVar32;
            if (1 < uVar27) {
              pSVar22 = pSVar26 + -2;
              local_11a8.geometryUserPtr._0_4_ = pSVar26[-2].dist;
              pSVar32 = pSVar26 + -1;
              if ((uint)local_11a8.geometryUserPtr < pSVar26[-1].dist) {
                SVar5 = *pSVar22;
                pSVar26[-2].dist = pSVar26[-1].dist;
                (pSVar22->ptr).ptr = (pSVar32->ptr).ptr;
                local_11a8.valid = (int *)SVar5.ptr.ptr;
                (pSVar32->ptr).ptr = (size_t)local_11a8.valid;
                local_11a8.geometryUserPtr._0_4_ = SVar5.dist;
                pSVar26[-1].dist = (uint)local_11a8.geometryUserPtr;
              }
              local_11a8.context = (RTCRayQueryContext *)(ulong)(uint)local_11a8.geometryUserPtr;
              if (uVar27 != 2) {
                valid_i = (vint<4> *)(pSVar26 + -3);
                uVar19 = pSVar26[-3].dist;
                if (uVar19 < pSVar26[-1].dist) {
                  uVar3 = ((RTCIntersectFunctionNArguments *)valid_i)->valid;
                  uVar6 = ((RTCIntersectFunctionNArguments *)valid_i)->geometryUserPtr;
                  pSVar26[-3].dist = pSVar26[-1].dist;
                  ((RTCIntersectFunctionNArguments *)valid_i)->valid = (int *)(pSVar32->ptr).ptr;
                  (pSVar32->ptr).ptr = uVar3;
                  local_11a8.geometryUserPtr._0_4_ = (uint)uVar6;
                  pSVar26[-1].dist = (uint)local_11a8.geometryUserPtr;
                  uVar19 = pSVar26[-3].dist;
                }
                local_11a8.context = (RTCRayQueryContext *)(ulong)uVar19;
                if (uVar19 < pSVar26[-2].dist) {
                  uVar4 = ((RTCIntersectFunctionNArguments *)valid_i)->valid;
                  uVar7 = ((RTCIntersectFunctionNArguments *)valid_i)->geometryUserPtr;
                  pSVar26[-3].dist = pSVar26[-2].dist;
                  ((RTCIntersectFunctionNArguments *)valid_i)->valid = (int *)(pSVar22->ptr).ptr;
                  (pSVar22->ptr).ptr = uVar4;
                  local_11a8.geometryUserPtr._0_4_ = (uint)uVar7;
                  local_11a8.context = (RTCRayQueryContext *)(ulong)(uint)local_11a8.geometryUserPtr
                  ;
                  pSVar26[-2].dist = (uint)local_11a8.geometryUserPtr;
                }
              }
            }
          }
          auVar81._4_4_ = -(uint)(auVar54._4_4_ < (float)local_11c8._4_4_);
          auVar81._0_4_ = -(uint)(auVar54._0_4_ < (float)local_11c8._0_4_);
          auVar81._8_4_ = -(uint)(auVar54._8_4_ < fStack_11c0);
          auVar81._12_4_ = -(uint)(auVar54._12_4_ < fStack_11bc);
          iVar21 = movmskps((int)pSVar22,auVar81);
          if (iVar21 != 0) {
            pGVar23 = (Geometry *)((ulong)((uint)pSVar31 & 0xf) - 8);
            local_1178 = pGVar23;
            if (pGVar23 != (Geometry *)0x0) {
              pGVar28 = (Geometry *)0x0;
              local_1058 = auVar81;
              do {
                local_11a8.geomID =
                     *(uint *)(((ulong)pSVar31 & 0xfffffffffffffff0) + (long)pGVar28 * 8);
                valid_i = (vint<4> *)(ulong)local_11a8.geomID;
                local_1178 = (context->scene->geometries).items[(long)valid_i].ptr;
                uVar19 = local_1178->mask;
                auVar42._0_4_ = -(uint)((uVar19 & *(uint *)(ray + 0x90)) == 0);
                auVar42._4_4_ = -(uint)((uVar19 & *(uint *)(ray + 0x94)) == 0);
                auVar42._8_4_ = -(uint)((uVar19 & *(uint *)(ray + 0x98)) == 0);
                auVar42._12_4_ = -(uint)((uVar19 & *(uint *)(ray + 0x9c)) == 0);
                fmin.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)(~auVar42 & auVar81);
                uVar19 = movmskps((int)local_11a8.context,(undefined1  [16])fmin.field_0);
                local_11a8.context = (RTCRayQueryContext *)(ulong)uVar19;
                if (uVar19 != 0) {
                  local_11a8.primID =
                       *(uint *)(((ulong)pSVar31 & 0xfffffffffffffff0) + 4 + (long)pGVar28 * 8);
                  local_11a8.geometryUserPtr = local_1178->userPtr;
                  local_11a8.valid = (int *)&fmin;
                  local_11a8.context = context->user;
                  local_11a8.N = 4;
                  local_1170 = 0;
                  local_1168 = context->args;
                  pp_Var25 = (_func_int **)local_1168->intersect;
                  if (pp_Var25 == (_func_int **)0x0) {
                    pp_Var25 = local_1178[1].super_RefCount._vptr_RefCount;
                  }
                  valid_i = (vint<4> *)&local_11a8;
                  local_11a8.rayhit = (RTCRayHitN *)ray;
                  local_1178 = (Geometry *)
                               (*(code *)pp_Var25)((RTCIntersectFunctionNArguments *)valid_i);
                  auVar81 = local_1058;
                  auVar137 = local_1068;
                  auVar138 = local_1078;
                  auVar139 = local_1088;
                  fVar118 = local_1098;
                  fVar125 = fStack_1094;
                  fVar127 = fStack_1090;
                  fVar129 = fStack_108c;
                  fVar140 = local_10a8;
                  fVar141 = fStack_10a4;
                  fVar142 = fStack_10a0;
                  fVar143 = fStack_109c;
                  fVar119 = local_10b8;
                  fVar126 = fStack_10b4;
                  fVar128 = fStack_10b0;
                  fVar130 = fStack_10ac;
                }
                pGVar28 = (Geometry *)((long)&(pGVar28->super_RefCount)._vptr_RefCount + 1);
              } while (pGVar23 != pGVar28);
            }
            uVar19 = auVar81._0_4_;
            auVar58._0_4_ = -(uint)(*(float *)(ray + 0x80) < (float)local_11c8._0_4_) & uVar19;
            uVar34 = auVar81._4_4_;
            auVar58._4_4_ = -(uint)(*(float *)(ray + 0x84) < (float)local_11c8._4_4_) & uVar34;
            uVar35 = auVar81._8_4_;
            auVar58._8_4_ = -(uint)(*(float *)(ray + 0x88) < fStack_11c0) & uVar35;
            uVar83 = auVar81._12_4_;
            auVar58._12_4_ = -(uint)(*(float *)(ray + 0x8c) < fStack_11bc) & uVar83;
            iVar21 = movmskps((int)local_1178,auVar58);
            if (iVar21 != 0) {
              auVar43._0_4_ = (uint)*(float *)(ray + 0x80) & uVar19;
              auVar43._4_4_ = (uint)*(float *)(ray + 0x84) & uVar34;
              auVar43._8_4_ = (uint)*(float *)(ray + 0x88) & uVar35;
              auVar43._12_4_ = (uint)*(float *)(ray + 0x8c) & uVar83;
              auVar82._0_4_ = ~uVar19 & local_11c8._0_4_;
              auVar82._4_4_ = ~uVar34 & local_11c8._4_4_;
              auVar82._8_4_ = ~uVar35 & (uint)fStack_11c0;
              auVar82._12_4_ = ~uVar83 & (uint)fStack_11bc;
              _local_11c8 = auVar82 | auVar43;
              auVar44._4_4_ = local_11c8._0_4_;
              auVar44._0_4_ = local_11c8._4_4_;
              auVar44._8_4_ = local_11c8._12_4_;
              auVar44._12_4_ = local_11c8._8_4_;
              auVar86 = maxps(auVar44,_local_11c8);
              auVar11._4_8_ = auVar58._8_8_;
              auVar11._0_4_ = auVar86._4_4_;
              auVar59._0_8_ = auVar11._0_8_ << 0x20;
              auVar59._8_4_ = auVar86._8_4_;
              auVar59._12_4_ = auVar86._12_4_;
              local_11b8._8_8_ = auVar86._8_8_;
              local_11b8._0_8_ = auVar59._8_8_;
              if (auVar86._8_4_ <= auVar86._0_4_) {
                local_11b8._0_4_ = auVar86._0_4_;
              }
            }
          }
        }
        uVar46 = local_11b8._0_4_;
        auVar41._4_4_ = uVar46;
        auVar41._0_4_ = uVar46;
        auVar41._8_4_ = uVar46;
        auVar41._12_4_ = uVar46;
LAB_00206405:
        pSVar22 = stack;
      } while (pSVar26 != pSVar22);
      uVar24 = uVar24 & ~CONCAT44((int)((ulong)lVar9 >> 0x20),uVar20);
    } while (uVar24 != 0);
  }
  return;
}

Assistant:

__forceinline vboolf4 operator ==(const vint4& a, const vint4& b) { return _mm_castsi128_ps(_mm_cmpeq_epi32(a, b)); }